

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c
# Opt level: O0

cf_errno_t cf_thread_join(cf_thread_t t,cf_uint32_t *retval)

{
  int iVar1;
  void *local_28;
  cf_void_t *ret;
  cf_uint32_t *retval_local;
  cf_thread_t t_local;
  
  local_28 = (void *)0x0;
  ret = retval;
  retval_local = (cf_uint32_t *)t;
  iVar1 = pthread_join(t,&local_28);
  if (iVar1 == 0) {
    if (ret != (cf_void_t *)0x0) {
      *(int *)ret = (int)local_28;
    }
    t_local._4_4_ = 0;
  }
  else {
    t_local._4_4_ = 1;
  }
  return t_local._4_4_;
}

Assistant:

cf_errno_t cf_thread_join(cf_thread_t t, cf_uint32_t* retval) {
#ifdef CF_OS_WIN
    DWORD retval_dw = 0;
    cf_uint32_t ret = WaitForSingleObject(t, INFINITE);
    if(retval) {
        (cf_void_t)GetExitCodeThread(t, &retval_dw);
        *retval = retval_dw;
    }
    if (WAIT_OBJECT_0 == ret) return CF_OK;
    else return CF_NOK;
#else
    cf_void_t* ret = 0;
    if(pthread_join(t, &ret) == 0) {
        if(retval) *retval = (cf_uint32_t)(cf_uintptr_t)ret;
        return CF_OK;
    }
    else return CF_NOK;
#endif
}